

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cn-get.c
# Opt level: O2

cn_cbor * cn_cbor_mapget_string(cn_cbor *cb,char *key)

{
  cn_cbor *pcVar1;
  cn_cbor *pcVar2;
  uint __line;
  int iVar3;
  size_t sVar4;
  cn_cbor **ppcVar5;
  char *__assertion;
  
  if (cb == (cn_cbor *)0x0) {
    __assertion = "cb";
    __line = 0x24;
  }
  else {
    if (key != (char *)0x0) {
      sVar4 = strlen(key);
      ppcVar5 = &cb->first_child;
      while( true ) {
        pcVar1 = *ppcVar5;
        if ((pcVar1 == (cn_cbor *)0x0) || (pcVar2 = pcVar1->next, pcVar2 == (cn_cbor *)0x0)) {
          return (cn_cbor *)0x0;
        }
        if (((pcVar1->type & ~CN_CBOR_TRUE) == CN_CBOR_BYTES) &&
           ((pcVar1->length == (int)sVar4 &&
            (iVar3 = bcmp(key,(pcVar1->v).bytes,(long)(int)sVar4), iVar3 == 0)))) break;
        ppcVar5 = &pcVar2->next;
      }
      return pcVar2;
    }
    __assertion = "key";
    __line = 0x25;
  }
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/cn-cbor/repo/src/cn-get.c"
                ,__line,"cn_cbor *cn_cbor_mapget_string(const cn_cbor *, const char *)");
}

Assistant:

MYLIB_EXPORT
cn_cbor* cn_cbor_mapget_string(const cn_cbor* cb, const char* key) {
  cn_cbor *cp;
  int keylen;
  assert(cb);
  assert(key);
  keylen = strlen(key);
  for (cp = cb->first_child; cp && cp->next; cp = cp->next->next) {
    switch(cp->type) {
    case CN_CBOR_TEXT: // fall-through
    case CN_CBOR_BYTES:
      if (keylen != cp->length) {
        continue;
      }
      if (memcmp(key, cp->v.str, keylen) == 0) {
        return cp->next;
      }
    default:
      ; // skip non-string keys
    }
  }
  return NULL;
}